

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_L12_read_scalefactors
               (drmp3_bs *bs,drmp3_uint8 *pba,drmp3_uint8 *scfcod,int bands,float *scf)

{
  byte bVar1;
  drmp3_uint32 dVar2;
  uint local_4c;
  int b;
  int mask;
  int ba;
  float s;
  int m;
  int i;
  float *scf_local;
  int bands_local;
  drmp3_uint8 *scfcod_local;
  drmp3_uint8 *pba_local;
  drmp3_bs *bs_local;
  
  _m = scf;
  scfcod_local = pba;
  for (s = 0.0; (int)s < bands; s = (float)((int)s + 1)) {
    mask = 0;
    bVar1 = *scfcod_local;
    if (bVar1 == 0) {
      local_4c = 0;
    }
    else {
      local_4c = (0x13 >> (scfcod[(int)s] & 0x1f) & 3U) + 4;
    }
    for (ba = 4; ba != 0; ba = ba >> 1) {
      if ((local_4c & ba) != 0) {
        dVar2 = drmp3_bs_get_bits(bs,6);
        mask = (int)(drmp3_L12_read_scalefactors::g_deq_L12
                     [(int)((uint)bVar1 * 3 + -6 + (int)dVar2 % 3)] *
                    (float)(0x200000 >> ((byte)((int)dVar2 / 3) & 0x1f)));
      }
      *_m = (float)mask;
      _m = _m + 1;
    }
    scfcod_local = scfcod_local + 1;
  }
  return;
}

Assistant:

static void drmp3_L12_read_scalefactors(drmp3_bs *bs, drmp3_uint8 *pba, drmp3_uint8 *scfcod, int bands, float *scf)
{
    static const float g_deq_L12[18*3] = {
#define DRMP3_DQ(x) 9.53674316e-07f/x, 7.56931807e-07f/x, 6.00777173e-07f/x
        DRMP3_DQ(3),DRMP3_DQ(7),DRMP3_DQ(15),DRMP3_DQ(31),DRMP3_DQ(63),DRMP3_DQ(127),DRMP3_DQ(255),DRMP3_DQ(511),DRMP3_DQ(1023),DRMP3_DQ(2047),DRMP3_DQ(4095),DRMP3_DQ(8191),DRMP3_DQ(16383),DRMP3_DQ(32767),DRMP3_DQ(65535),DRMP3_DQ(3),DRMP3_DQ(5),DRMP3_DQ(9)
    };
    int i, m;
    for (i = 0; i < bands; i++)
    {
        float s = 0;
        int ba = *pba++;
        int mask = ba ? 4 + ((19 >> scfcod[i]) & 3) : 0;
        for (m = 4; m; m >>= 1)
        {
            if (mask & m)
            {
                int b = drmp3_bs_get_bits(bs, 6);
                s = g_deq_L12[ba*3 - 6 + b % 3]*(int)(1 << 21 >> b/3);
            }
            *scf++ = s;
        }
    }
}